

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManComputeCuts(Sbl_Man_t *p)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Vec_Int_t *pVVar7;
  Gia_Obj_t *pGVar8;
  abctime aVar9;
  bool bVar10;
  Gia_Obj_t *pFanin;
  ulong uStack_60;
  int Obj_1;
  word CutN2;
  word CutN1;
  word CutI2;
  word CutI1;
  int Obj;
  int nObjs;
  int Fanin;
  int Index;
  int k;
  int i;
  Vec_Int_t *vFanins;
  Gia_Obj_t *pObj;
  abctime clk;
  Sbl_Man_t *p_local;
  
  aVar6 = Abc_Clock();
  iVar3 = Vec_IntSize(p->vLeaves);
  iVar4 = Vec_IntSize(p->vAnds);
  iVar5 = Vec_IntSize(p->vLeaves);
  if ((0x80 < iVar5) || (iVar5 = Vec_IntSize(p->vAnds), p->nVars < iVar5)) {
    __assert_fail("Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x2e2,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  Vec_IntClear(p->vCutsStart);
  Vec_IntClear(p->vCutsObj);
  Vec_IntClear(p->vCutsNum);
  Vec_WrdClear(p->vCutsI1);
  Vec_WrdClear(p->vCutsI2);
  Vec_WrdClear(p->vCutsN1);
  Vec_WrdClear(p->vCutsN2);
  Index = 0;
  while( true ) {
    iVar5 = Vec_IntSize(p->vLeaves);
    bVar10 = false;
    if (Index < iVar5) {
      pGVar2 = p->pGia;
      iVar5 = Vec_IntEntry(p->vLeaves,Index);
      vFanins = (Vec_Int_t *)Gia_ManObj(pGVar2,iVar5);
      bVar10 = vFanins != (Vec_Int_t *)0x0;
    }
    if (!bVar10) break;
    pVVar7 = p->vCutsStart;
    iVar5 = Vec_WrdSize(p->vCutsI1);
    Vec_IntPush(pVVar7,iVar5);
    Vec_IntPush(p->vCutsObj,-1);
    Vec_IntPush(p->vCutsNum,1);
    if (Index < 0x40) {
      Vec_WrdPush(p->vCutsI1,1L << ((byte)Index & 0x3f));
      Vec_WrdPush(p->vCutsI2,0);
    }
    else {
      Vec_WrdPush(p->vCutsI1,0);
      Vec_WrdPush(p->vCutsI2,1L << ((byte)Index - 0x40 & 0x3f));
    }
    Vec_WrdPush(p->vCutsN1,0);
    Vec_WrdPush(p->vCutsN2,0);
    *(int *)&vFanins->pArray = Index;
    Index = Index + 1;
  }
  Index = 0;
  while( true ) {
    iVar5 = Vec_IntSize(p->vAnds);
    bVar10 = false;
    if (Index < iVar5) {
      pGVar2 = p->pGia;
      iVar5 = Vec_IntEntry(p->vAnds,Index);
      vFanins = (Vec_Int_t *)Gia_ManObj(pGVar2,iVar5);
      bVar10 = vFanins != (Vec_Int_t *)0x0;
    }
    if (!bVar10) break;
    iVar5 = Gia_ObjIsAnd((Gia_Obj_t *)vFanins);
    if (iVar5 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x301,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
    }
    pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)vFanins);
    if (pGVar8->Value == 0xffffffff) {
      __assert_fail("~Gia_ObjFanin0(pObj)->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x302,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
    }
    pGVar8 = Gia_ObjFanin1((Gia_Obj_t *)vFanins);
    if (pGVar8->Value == 0xffffffff) {
      __assert_fail("~Gia_ObjFanin1(pObj)->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                    ,0x303,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
    }
    pGVar8 = Gia_ObjFanin0((Gia_Obj_t *)vFanins);
    uVar1 = pGVar8->Value;
    pGVar8 = Gia_ObjFanin1((Gia_Obj_t *)vFanins);
    Sbl_ManComputeCutsOne(p,uVar1,pGVar8->Value,Index);
    iVar5 = Vec_IntSize(p->vLeaves);
    *(int *)&vFanins->pArray = iVar5 + Index;
    Index = Index + 1;
  }
  iVar5 = Vec_IntSize(p->vCutsStart);
  if (iVar5 != iVar3 + iVar4) {
    __assert_fail("Vec_IntSize(p->vCutsStart) == nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x307,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  iVar5 = Vec_IntSize(p->vCutsNum);
  if (iVar5 != iVar3 + iVar4) {
    __assert_fail("Vec_IntSize(p->vCutsNum) == nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x308,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  iVar3 = Vec_WrdSize(p->vCutsI1);
  iVar4 = Vec_WrdSize(p->vCutsN1);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_WrdSize(p->vCutsN1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x309,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  iVar3 = Vec_WrdSize(p->vCutsI2);
  iVar4 = Vec_WrdSize(p->vCutsN2);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_WrdSize(p->vCutsI2) == Vec_WrdSize(p->vCutsN2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x30a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  iVar3 = Vec_WrdSize(p->vCutsI1);
  iVar4 = Vec_IntSize(p->vCutsObj);
  if (iVar3 != iVar4) {
    __assert_fail("Vec_WrdSize(p->vCutsI1) == Vec_IntSize(p->vCutsObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x30b,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
  }
  Vec_IntClear(p->vRootVars);
  Index = 0;
  do {
    iVar3 = Vec_IntSize(p->vRoots);
    bVar10 = false;
    if (Index < iVar3) {
      pGVar2 = p->pGia;
      iVar3 = Vec_IntEntry(p->vRoots,Index);
      vFanins = (Vec_Int_t *)Gia_ManObj(pGVar2,iVar3);
      bVar10 = vFanins != (Vec_Int_t *)0x0;
    }
    if (!bVar10) {
      Vec_IntClear(p->vPolar);
      Vec_IntClear(p->vSolInit);
      Index = 0;
      while( true ) {
        iVar3 = Vec_IntSize(p->vAnds);
        bVar10 = false;
        if (Index < iVar3) {
          pGVar2 = p->pGia;
          iVar3 = Vec_IntEntry(p->vAnds,Index);
          vFanins = (Vec_Int_t *)Gia_ManObj(pGVar2,iVar3);
          bVar10 = vFanins != (Vec_Int_t *)0x0;
        }
        if (!bVar10) break;
        CutI2 = 0;
        CutN1 = 0;
        CutN2 = 0;
        uStack_60 = 0;
        iVar3 = Gia_ObjId(p->pGia,(Gia_Obj_t *)vFanins);
        iVar4 = Gia_ObjIsLut2(p->pGia,iVar3);
        if (iVar4 != 0) {
          iVar4 = *(int *)&vFanins->pArray;
          iVar5 = Vec_IntSize(p->vLeaves);
          if (iVar4 != iVar5 + Index) {
            __assert_fail("(int)pObj->Value == Vec_IntSize(p->vLeaves) + i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,800,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
          }
          Vec_IntPush(p->vPolar,Index);
          Vec_IntPush(p->vSolInit,Index);
          pVVar7 = Gia_ObjLutFanins2(p->pGia,iVar3);
          for (Fanin = 0; iVar3 = Vec_IntSize(pVVar7), Fanin < iVar3; Fanin = Fanin + 1) {
            iVar3 = Vec_IntEntry(pVVar7,Fanin);
            pGVar8 = Gia_ManObj(p->pGia,iVar3);
            uVar1 = pGVar8->Value;
            iVar4 = Vec_IntSize(p->vLeaves);
            if ((iVar4 <= (int)uVar1) && (iVar3 = Gia_ObjIsLut2(p->pGia,iVar3), iVar3 == 0)) {
              __assert_fail("(int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                            ,0x32a,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
            }
            if (pGVar8->Value != 0xffffffff) {
              if (pGVar8->Value == 0xffffffff) {
                __assert_fail("~pFanin->Value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                              ,0x32f,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
              }
              uVar1 = pGVar8->Value;
              iVar3 = Vec_IntSize(p->vLeaves);
              if ((int)uVar1 < iVar3) {
                if ((int)pGVar8->Value < 0x40) {
                  CutI2 = 1L << ((byte)pGVar8->Value & 0x3f) | CutI2;
                }
                else {
                  CutN1 = 1L << ((char)pGVar8->Value - 0x40U & 0x3f) | CutN1;
                }
              }
              else {
                uVar1 = pGVar8->Value;
                iVar3 = Vec_IntSize(p->vLeaves);
                if (uVar1 - iVar3 < 0x40) {
                  uVar1 = pGVar8->Value;
                  iVar3 = Vec_IntSize(p->vLeaves);
                  CutN2 = 1L << ((char)uVar1 - (char)iVar3 & 0x3fU) | CutN2;
                }
                else {
                  uVar1 = pGVar8->Value;
                  iVar3 = Vec_IntSize(p->vLeaves);
                  uStack_60 = 1L << (((char)uVar1 - (char)iVar3) - 0x40U & 0x3f) | uStack_60;
                }
              }
            }
          }
          iVar3 = Vec_IntSize(p->vLeaves);
          iVar3 = Sbl_ManFindCut(p,iVar3 + Index,CutI2,CutN1,CutN2,uStack_60);
          if (-1 < iVar3) {
            if (iVar3 < 0) {
              __assert_fail("Index >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                            ,0x346,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
            }
            Vec_IntPush(p->vPolar,p->FirstVar + iVar3);
          }
        }
        Index = Index + 1;
      }
      Index = 0;
      while( true ) {
        iVar3 = Vec_IntSize(p->vLeaves);
        bVar10 = false;
        if (Index < iVar3) {
          pGVar2 = p->pGia;
          iVar3 = Vec_IntEntry(p->vLeaves,Index);
          vFanins = (Vec_Int_t *)Gia_ManObj(pGVar2,iVar3);
          bVar10 = vFanins != (Vec_Int_t *)0x0;
        }
        if (!bVar10) break;
        *(undefined4 *)&vFanins->pArray = 0xffffffff;
        Index = Index + 1;
      }
      Index = 0;
      while( true ) {
        iVar3 = Vec_IntSize(p->vAnds);
        bVar10 = false;
        if (Index < iVar3) {
          pGVar2 = p->pGia;
          iVar3 = Vec_IntEntry(p->vAnds,Index);
          vFanins = (Vec_Int_t *)Gia_ManObj(pGVar2,iVar3);
          bVar10 = vFanins != (Vec_Int_t *)0x0;
        }
        if (!bVar10) break;
        *(undefined4 *)&vFanins->pArray = 0xffffffff;
        Index = Index + 1;
      }
      aVar9 = Abc_Clock();
      p->timeCut = (aVar9 - aVar6) + p->timeCut;
      iVar3 = Vec_WrdSize(p->vCutsI1);
      return iVar3;
    }
    iVar3 = Gia_ObjId(p->pGia,(Gia_Obj_t *)vFanins);
    iVar4 = Gia_ObjIsCi((Gia_Obj_t *)vFanins);
    if (iVar4 == 0) {
      iVar3 = Gia_ObjIsLut2(p->pGia,iVar3);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, Obj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x313,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      if (*(int *)&vFanins->pArray == -1) {
        __assert_fail("~pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x314,"int Sbl_ManComputeCuts(Sbl_Man_t *)");
      }
      pVVar7 = p->vRootVars;
      iVar3 = *(int *)&vFanins->pArray;
      iVar4 = Vec_IntSize(p->vLeaves);
      Vec_IntPush(pVVar7,iVar3 - iVar4);
    }
    Index = Index + 1;
  } while( true );
}

Assistant:

int Sbl_ManComputeCuts( Sbl_Man_t * p )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; Vec_Int_t * vFanins;
    int i, k, Index, Fanin, nObjs = Vec_IntSize(p->vLeaves) + Vec_IntSize(p->vAnds);
    assert( Vec_IntSize(p->vLeaves) <= 128 && Vec_IntSize(p->vAnds) <= p->nVars );
    // assign leaf cuts
    Vec_IntClear( p->vCutsStart );
    Vec_IntClear( p->vCutsObj );
    Vec_IntClear( p->vCutsNum );
    Vec_WrdClear( p->vCutsI1 );
    Vec_WrdClear( p->vCutsI2 );
    Vec_WrdClear( p->vCutsN1 );
    Vec_WrdClear( p->vCutsN2 );
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
    {
        Vec_IntPush( p->vCutsStart, Vec_WrdSize(p->vCutsI1) );
        Vec_IntPush( p->vCutsObj, -1 );
        Vec_IntPush( p->vCutsNum, 1 );
        if ( i < 64 )
        {
            Vec_WrdPush( p->vCutsI1, (((word)1) << i) );
            Vec_WrdPush( p->vCutsI2, 0 );
        }
        else
        {
            Vec_WrdPush( p->vCutsI1, 0 );
            Vec_WrdPush( p->vCutsI2, (((word)1) << (i-64)) );
        }
        Vec_WrdPush( p->vCutsN1, 0 );
        Vec_WrdPush( p->vCutsN2, 0 );
        pObj->Value = i;
    }
    // assign internal cuts
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        assert( Gia_ObjIsAnd(pObj) );
        assert( ~Gia_ObjFanin0(pObj)->Value );
        assert( ~Gia_ObjFanin1(pObj)->Value );
        Sbl_ManComputeCutsOne( p, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value, i );
        pObj->Value = Vec_IntSize(p->vLeaves) + i;
    }
    assert( Vec_IntSize(p->vCutsStart) == nObjs );
    assert( Vec_IntSize(p->vCutsNum)   == nObjs );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_WrdSize(p->vCutsN1) );
    assert( Vec_WrdSize(p->vCutsI2)    == Vec_WrdSize(p->vCutsN2) );
    assert( Vec_WrdSize(p->vCutsI1)    == Vec_IntSize(p->vCutsObj) );
    // check that roots are mapped nodes
    Vec_IntClear( p->vRootVars );
    Gia_ManForEachObjVec( p->vRoots, p->pGia, pObj, i )
    {
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsLut2(p->pGia, Obj) );
        assert( ~pObj->Value );
        Vec_IntPush( p->vRootVars, pObj->Value - Vec_IntSize(p->vLeaves) );
    }
    // create current solution
    Vec_IntClear( p->vPolar );
    Vec_IntClear( p->vSolInit );
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
    {
        word CutI1 = 0, CutI2 = 0, CutN1 = 0, CutN2 = 0;
        int Obj = Gia_ObjId(p->pGia, pObj);
        if ( !Gia_ObjIsLut2(p->pGia, Obj) )
            continue;
        assert( (int)pObj->Value == Vec_IntSize(p->vLeaves) + i );
        // add node
        Vec_IntPush( p->vPolar, i );
        Vec_IntPush( p->vSolInit, i );
        // add its cut
        //Gia_LutForEachFaninObj( p->pGia, Obj, pFanin, k )
        vFanins = Gia_ObjLutFanins2( p->pGia, Obj );
        Vec_IntForEachEntry( vFanins, Fanin, k )
        {
            Gia_Obj_t * pFanin = Gia_ManObj( p->pGia, Fanin );
            assert( (int)pFanin->Value < Vec_IntSize(p->vLeaves) || Gia_ObjIsLut2(p->pGia, Fanin) );
//            if ( ~pFanin->Value == 0 )
//                Gia_ManPrintConeMulti( p->pGia, p->vAnds, p->vLeaves, p->vPath );
            if ( ~pFanin->Value == 0 ) 
                continue;
            assert( ~pFanin->Value );
            if ( (int)pFanin->Value < Vec_IntSize(p->vLeaves) )
            {
                if ( (int)pFanin->Value < 64 )
                    CutI1 |= ((word)1 << pFanin->Value);
                else
                    CutI2 |= ((word)1 << (pFanin->Value - 64));
            }
            else
            {
                if ( pFanin->Value - Vec_IntSize(p->vLeaves) < 64 )
                    CutN1 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves)));
                else
                    CutN2 |= ((word)1 << (pFanin->Value - Vec_IntSize(p->vLeaves) - 64));
            }
        }
        // find the new cut
        Index = Sbl_ManFindCut( p, Vec_IntSize(p->vLeaves) + i, CutI1, CutI2, CutN1, CutN2 );
        if ( Index < 0 )
        {
            //printf( "Cannot find the available cut.\n" );
            continue;
        }
        assert( Index >= 0 );
        Vec_IntPush( p->vPolar, p->FirstVar+Index );
    }
    // clean value
    Gia_ManForEachObjVec( p->vLeaves, p->pGia, pObj, i )
        pObj->Value = ~0;
    Gia_ManForEachObjVec( p->vAnds, p->pGia, pObj, i )
        pObj->Value = ~0;
    p->timeCut += Abc_Clock() - clk;
    return Vec_WrdSize(p->vCutsI1);
}